

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O0

void DrawOneWeapon(player_t *CPlayer,int x,int *y,AWeapon *weapon)

{
  AWeapon *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  AWeapon *pAVar5;
  MetaClass *base;
  FTexture *this;
  int local_48;
  int rh;
  int h;
  int w;
  FTexture *tex;
  FTextureID picnum;
  int trans;
  AWeapon *weapon_local;
  int *y_local;
  int x_local;
  player_t *CPlayer_local;
  
  if ((*(uint *)&(weapon->super_AInventory).field_0x4dc & 0x400) == 0) {
    _picnum = weapon;
    pAVar5 = TObjPtr::operator_cast_to_AWeapon_((TObjPtr *)&weapon->SisterWeapon);
    pAVar1 = _picnum;
    if (pAVar5 != (AWeapon *)0x0) {
      pAVar5 = TObjPtr<AWeapon>::operator->(&_picnum->SisterWeapon);
      base = AWeapon::GetClass(pAVar5);
      bVar2 = DObject::IsKindOf((DObject *)pAVar1,(PClass *)base);
      if (bVar2) {
        return;
      }
    }
    pAVar1 = _picnum;
    tex._4_4_ = 0x6666;
    if ((CPlayer->ReadyWeapon != (AWeapon *)0x0) &&
       ((_picnum == CPlayer->ReadyWeapon ||
        (pAVar5 = TObjPtr::operator_cast_to_AWeapon_((TObjPtr *)&CPlayer->ReadyWeapon->SisterWeapon)
        , pAVar1 == pAVar5)))) {
      tex._4_4_ = 0xd999;
    }
    tex._0_4_ = GetInventoryIcon(&_picnum->super_AInventory,0x10,(bool *)0x0);
    bVar2 = FTextureID::isValid((FTextureID *)&tex);
    if (bVar2) {
      this = FTextureManager::operator[](&TexMan,tex._0_4_);
      iVar3 = FTexture::GetWidth(this);
      iVar4 = FTexture::GetHeight(this);
      if (iVar4 < iVar3) {
        local_48 = 8;
      }
      else {
        local_48 = 0x10;
        *y = *y + -8;
      }
      DrawImageToBox(this,x + -0x18,*y,0x14,local_48,tex._4_4_);
      *y = *y + -10;
    }
  }
  return;
}

Assistant:

static void DrawOneWeapon(player_t * CPlayer, int x, int & y, AWeapon * weapon)
{
	int trans;

	// Powered up weapons and inherited sister weapons are not displayed.
	if (weapon->WeaponFlags & WIF_POWERED_UP) return;
	if (weapon->SisterWeapon && weapon->IsKindOf(weapon->SisterWeapon->GetClass())) return;

	trans=0x6666;
	if (CPlayer->ReadyWeapon)
	{
		if (weapon==CPlayer->ReadyWeapon || weapon==CPlayer->ReadyWeapon->SisterWeapon) trans=0xd999;
	}

	FTextureID picnum = GetInventoryIcon(weapon, DI_ALTICONFIRST);

	if (picnum.isValid())
	{
		FTexture * tex = TexMan[picnum];
		int w = tex->GetWidth();
		int h = tex->GetHeight();
		int rh;
		if (w>h) rh=8;
		else rh=16,y-=8;		// don't draw tall sprites too small!
		DrawImageToBox(tex, x-24, y, 20, rh, trans);
		y-=10;
	}
}